

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugLine::LineTable::getFileLineInfoForAddress
          (LineTable *this,SectionedAddress Address,char *CompDir,FileLineInfoKind Kind,
          DILineInfo *Result)

{
  ushort uVar1;
  bool bVar2;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::StringRef,_true>_2 local_88;
  undefined8 local_78;
  StringRef local_70;
  const_reference local_60;
  value_type *Row;
  uint64_t local_50;
  uint32_t local_44;
  DILineInfo *pDStack_40;
  uint32_t RowIndex;
  DILineInfo *Result_local;
  char *pcStack_30;
  FileLineInfoKind Kind_local;
  char *CompDir_local;
  LineTable *this_local;
  SectionedAddress Address_local;
  
  local_50 = Address.SectionIndex;
  Row = (value_type *)Address.Address;
  pDStack_40 = Result;
  Result_local._4_4_ = Kind;
  pcStack_30 = CompDir;
  CompDir_local = (char *)this;
  this_local = (LineTable *)Row;
  Address_local.Address = local_50;
  local_44 = lookupAddress(this,Address);
  if (local_44 == 0xffffffff) {
    Address_local.SectionIndex._7_1_ = false;
  }
  else {
    local_60 = std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::
               operator[](&this->Rows,(ulong)local_44);
    uVar1 = local_60->File;
    StringRef::StringRef(&local_70,pcStack_30);
    bVar2 = getFileNameByIndex(this,(ulong)uVar1,local_70,Result_local._4_4_,&pDStack_40->FileName);
    if (bVar2) {
      pDStack_40->Line = local_60->Line;
      pDStack_40->Column = (uint)local_60->Column;
      pDStack_40->Discriminator = local_60->Discriminator;
      getSourceByIndex((Optional<llvm::StringRef> *)&local_88.value,this,(ulong)local_60->File,
                       Result_local._4_4_);
      (pDStack_40->Source).Storage.field_0.value.Data = local_88.value.Data;
      (pDStack_40->Source).Storage.field_0.value.Length = local_88.value.Length;
      *(undefined8 *)&(pDStack_40->Source).Storage.hasVal = local_78;
      Address_local.SectionIndex._7_1_ = true;
    }
    else {
      Address_local.SectionIndex._7_1_ = false;
    }
  }
  return Address_local.SectionIndex._7_1_;
}

Assistant:

bool DWARFDebugLine::LineTable::getFileLineInfoForAddress(
    object::SectionedAddress Address, const char *CompDir,
    FileLineInfoKind Kind, DILineInfo &Result) const {
  // Get the index of row we're looking for in the line table.
  uint32_t RowIndex = lookupAddress(Address);
  if (RowIndex == -1U)
    return false;
  // Take file number and line/column from the row.
  const auto &Row = Rows[RowIndex];
  if (!getFileNameByIndex(Row.File, CompDir, Kind, Result.FileName))
    return false;
  Result.Line = Row.Line;
  Result.Column = Row.Column;
  Result.Discriminator = Row.Discriminator;
  Result.Source = getSourceByIndex(Row.File, Kind);
  return true;
}